

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_difflist * lyd_diff(lyd_node *first,lyd_node *second,int options)

{
  lys_node *plVar1;
  lyd_node *first_00;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  diff_ordered_dist *pdVar5;
  int iVar6;
  uint uVar7;
  LY_ERR *pLVar8;
  ly_set *plVar9;
  void *pvVar10;
  matchlist_s *pmVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  bool bVar14;
  lyd_node *local_120;
  lyd_node *local_f8;
  diff_ordered_item item_aux;
  diff_ordered_dist *dist_iter;
  diff_ordered_dist *dist_aux;
  diff_ordered *ordered;
  ly_set *ordset;
  matchlist_s *mlaux;
  matchlist_s *matchlist;
  uint local_90;
  uint k;
  uint j;
  uint i;
  uint index2;
  uint index;
  uint size2;
  uint size;
  void *new;
  lyd_difflist *result2;
  lyd_difflist *result;
  lyd_node *next2;
  lyd_node *next1;
  lyd_node *parent;
  lyd_node *aux;
  lyd_node *iter;
  lyd_node *elem2;
  lyd_node *elem1;
  int rc;
  int options_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  next1 = (lyd_node *)0x0;
  new = (void *)0x0;
  i = 0;
  j = 0;
  mlaux = (matchlist_s *)0x0;
  ordered = (diff_ordered *)0x0;
  elem1._4_4_ = options;
  _rc = second;
  second_local = first;
  if (first == (lyd_node *)0x0) {
    if ((second != (lyd_node *)0x0) && (second->parent != (lyd_node *)0x0)) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EINVAL;
      ly_log(LY_LLERR,"%s: \"first\" parameter is NULL and \"second\" is not top level.","lyd_diff")
      ;
      return (lyd_difflist *)0x0;
    }
    result2 = lyd_diff_init_difflist(&index);
    aux = _rc;
    do {
      uVar7 = i;
      if (aux == (lyd_node *)0x0) {
        return result2;
      }
      if (((aux->field_0x9 & 1) == 0) || ((elem1._4_4_ & 1) != 0)) {
        i = i + 1;
        iVar6 = lyd_difflist_add(result2,&index,uVar7,LYD_DIFF_CREATED,(lyd_node *)0x0,aux);
        if (iVar6 != 0) goto LAB_0018b971;
      }
      if ((elem1._4_4_ & 0x800) != 0) {
        return result2;
      }
      aux = aux->next;
    } while( true );
  }
  if (second == (lyd_node *)0x0) {
    result2 = lyd_diff_init_difflist(&index);
    aux = second_local;
    do {
      uVar7 = i;
      if (aux == (lyd_node *)0x0) {
        return result2;
      }
      if (((aux->field_0x9 & 1) == 0) || ((elem1._4_4_ & 1) != 0)) {
        i = i + 1;
        iVar6 = lyd_difflist_add(result2,&index,uVar7,LYD_DIFF_DELETED,aux,(lyd_node *)0x0);
        if (iVar6 != 0) goto LAB_0018b971;
      }
      if ((elem1._4_4_ & 0x800) != 0) {
        return result2;
      }
      aux = aux->next;
    } while( true );
  }
  if ((options & 0x800U) == 0) {
    if (first->parent == (lyd_node *)0x0) {
      while (second_local->prev->next != (lyd_node *)0x0) {
        second_local = second_local->prev;
      }
    }
    else {
      second_local = first->parent->child;
    }
    if (second->parent == (lyd_node *)0x0) {
      while (_rc->prev->next != (lyd_node *)0x0) {
        _rc = _rc->prev;
      }
    }
    else {
      _rc = second->parent->child;
    }
    if ((((second_local->parent != (lyd_node *)0x0) && (_rc->parent != (lyd_node *)0x0)) &&
        (second_local->parent->schema != _rc->parent->schema)) ||
       ((second_local->parent == (lyd_node *)0x0 && (second_local->parent != _rc->parent)))) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EINVAL;
      ly_log(LY_LLERR,"%s: incompatible trees with different parents.","lyd_diff");
      return (lyd_difflist *)0x0;
    }
  }
  else {
    if (first->schema != second->schema) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EINVAL;
      ly_log(LY_LLERR,"%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.","lyd_diff"
            );
      return (lyd_difflist *)0x0;
    }
    second_local = first->child;
    _rc = second->child;
  }
  if (second_local == _rc) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: comparing the same tree does not make sense.","lyd_diff");
    return (lyd_difflist *)0x0;
  }
  result2 = lyd_diff_init_difflist(&index);
  new = lyd_diff_init_difflist(&index2);
  mlaux = (matchlist_s *)malloc(0x18);
  mlaux->i = 0;
  plVar9 = ly_set_new();
  mlaux->match = plVar9;
  mlaux->prev = (matchlist_s *)0x0;
  ordered = (diff_ordered *)ly_set_new();
  next2 = second_local;
  iter = _rc;
LAB_0018a8fd:
  result = (lyd_difflist *)iter;
  if (iter != (lyd_node *)0x0) {
    elem2 = next2;
    uVar7 = j;
    if (((iter->field_0x9 & 1) == 0) || ((elem1._4_4_ & 1) != 0)) {
      for (aux = next2; aux != (lyd_node *)0x0; aux = aux->next) {
        if (aux->schema == iter->schema) {
          elem1._0_4_ = lyd_diff_compare(aux,iter,result2,&index,&i,mlaux->match,(ly_set *)ordered,
                                         elem1._4_4_);
          if ((int)elem1 == -1) goto LAB_0018b971;
          if ((int)elem1 == 0) break;
        }
      }
      if (aux == (lyd_node *)0x0) {
        uVar7 = j + 1;
        if (elem2 == (lyd_node *)0x0) {
          local_f8 = next1;
        }
        else {
          local_f8 = elem2->parent;
        }
        iVar6 = lyd_difflist_add((lyd_difflist *)new,&index2,j,LYD_DIFF_CREATED,local_f8,iter);
        if (iVar6 != 0) goto LAB_0018b971;
        if ((elem2 != (lyd_node *)0x0) && ((iter->schema->flags & 0x100) != 0)) {
          for (parent = iter->prev;
              (parent->next != (lyd_node *)0x0 && (parent->schema != iter->schema));
              parent = parent->prev) {
          }
          if (parent->next == (lyd_node *)0x0) {
            parent = (lyd_node *)0x0;
          }
          iVar6 = lyd_difflist_add((lyd_difflist *)new,&index2,uVar7,LYD_DIFF_MOVEDAFTER2,parent,
                                   iter);
          uVar7 = j + 2;
          if (iVar6 != 0) goto LAB_0018b971;
        }
      }
    }
    j = uVar7;
    next2 = elem2;
    result = (lyd_difflist *)iter->next;
    if ((lyd_node *)result != (lyd_node *)0x0) goto LAB_0018af0b;
    k = *(uint *)((long)&ordered->schema + 4);
    while ((k != 0 &&
           (plVar1 = ((ly_set_set *)&ordered->parent)->s[k - 1], lVar4._0_2_ = plVar1->flags,
           lVar4._2_1_ = plVar1->ext_size, lVar4._3_1_ = plVar1->iffeature_size,
           lVar4._4_1_ = plVar1->padding[0], lVar4._5_1_ = plVar1->padding[1],
           lVar4._6_1_ = plVar1->padding[2], lVar4._7_1_ = plVar1->padding[3], lVar4 == 0))) {
      pvVar10 = calloc((ulong)*(uint *)&plVar1->ref,0x18);
      *(void **)&plVar1->flags = pvVar10;
      plVar1->ext = (lys_ext_instance **)0x0;
      *(undefined4 *)&plVar1->ref = 0;
      k = k - 1;
    }
    if (iter->parent == _rc->parent) {
      iter = _rc;
    }
    else {
      iter = iter->parent->child;
    }
    for (aux = iter; aux != (lyd_node *)0x0; aux = aux->next) {
      if ((aux->validity & 0x80) != 0) {
        if (mlaux->i == mlaux->match->number) {
          if (aux != iter) {
            pLVar8 = ly_errno_location();
            *pLVar8 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0xb80);
            goto LAB_0018b971;
          }
          aux = (lyd_node *)0x0;
          break;
        }
        aux->validity = aux->validity & 0x7f;
        if (((aux->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
           ((aux->schema->flags & 0x100) != 0)) {
          for (local_90 = *(uint *)((long)&ordered->schema + 4); local_90 != 0;
              local_90 = local_90 - 1) {
            plVar1 = ((ly_set_set *)&ordered->parent)->s[local_90 - 1];
            if (((lys_node *)plVar1->name == aux->schema) &&
               (iVar6 = lyd_diff_equivnode((lyd_node *)plVar1->dsc,aux->parent), iVar6 != 0)) {
              lyd_diff_move_preprocess
                        ((diff_ordered *)plVar1,(lyd_node *)(mlaux->match->set).s[mlaux->i],aux);
              break;
            }
          }
        }
        if (((aux->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) &&
           (aux->child != (lyd_node *)0x0)) goto LAB_0018ad5c;
        mlaux->i = mlaux->i + 1;
      }
    }
    goto LAB_0018ae9e;
  }
LAB_0018b2b7:
  ly_set_free(mlaux->match);
  free(mlaux);
  mlaux = (matchlist_s *)0x0;
  elem2 = second_local;
  while (uVar7 = i, next2 = elem2, elem2 != (lyd_node *)0x0) {
    if ((elem2->validity & 0x80) == 0) {
      if (((elem2->field_0x9 & 1) != 0) && ((elem1._4_4_ & 1) == 0)) goto LAB_0018b366;
      i = i + 1;
      iVar6 = lyd_difflist_add(result2,&index,uVar7,LYD_DIFF_DELETED,elem2,(lyd_node *)0x0);
      if (iVar6 != 0) goto LAB_0018b971;
LAB_0018b399:
      next2 = elem2->next;
    }
    else {
      elem2->validity = elem2->validity & 0x7f;
LAB_0018b366:
      if ((elem2->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        next2 = elem2->child;
      }
      else {
        next2 = (lyd_node *)0x0;
      }
      if (next2 == (lyd_node *)0x0) goto LAB_0018b399;
    }
    while ((next2 == (lyd_node *)0x0 && (elem2 = elem2->parent, elem2 != second_local->parent))) {
      next2 = elem2->next;
    }
    elem2 = next2;
  }
  for (k = 0; k < *(uint *)((long)&ordered->schema + 4); k = k + 1) {
    plVar1 = ((ly_set_set *)&ordered->parent)->s[k];
    if (*(int *)(plVar1->ext + 1) != 0) {
      item_aux.dist = (diff_ordered_dist *)plVar1->ext;
      pdVar5 = item_aux.dist;
      do {
        while (uVar7 = i, (item_aux.dist)->dist != 0) {
          matchlist._4_4_ = 0;
          while ((matchlist._4_4_ < *(uint *)&plVar1->ref &&
                 (*(diff_ordered_dist **)
                   (*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18 + 0x10) != item_aux.dist
                 ))) {
            matchlist._4_4_ = matchlist._4_4_ + 1;
          }
          puVar12 = (undefined8 *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18);
          first_00 = (lyd_node *)*puVar12;
          uVar2 = puVar12[1];
          uVar3 = puVar12[2];
          if ((item_aux.dist)->dist < 1) {
            while ((item_aux.dist)->dist != 0) {
              puVar12 = (undefined8 *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18);
              puVar13 = (undefined8 *)
                        (*(long *)&plVar1->flags + (ulong)(matchlist._4_4_ - 1) * 0x18);
              *puVar12 = *puVar13;
              puVar12[1] = puVar13[1];
              puVar12[2] = puVar13[2];
              lVar4 = *(long *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18 + 0x10);
              *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + -1;
              (item_aux.dist)->dist = (item_aux.dist)->dist + 1;
              matchlist._4_4_ = matchlist._4_4_ - 1;
            }
          }
          else {
            while ((item_aux.dist)->dist != 0) {
              puVar12 = (undefined8 *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18);
              puVar13 = (undefined8 *)
                        (*(long *)&plVar1->flags + (ulong)(matchlist._4_4_ + 1) * 0x18);
              *puVar12 = *puVar13;
              puVar12[1] = puVar13[1];
              puVar12[2] = puVar13[2];
              lVar4 = *(long *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18 + 0x10);
              *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
              (item_aux.dist)->dist = (item_aux.dist)->dist + -1;
              matchlist._4_4_ = matchlist._4_4_ + 1;
            }
          }
          puVar12 = (undefined8 *)(*(long *)&plVar1->flags + (ulong)matchlist._4_4_ * 0x18);
          *puVar12 = first_00;
          puVar12[1] = uVar2;
          puVar12[2] = uVar3;
          i = i + 1;
          if (matchlist._4_4_ == 0) {
            local_120 = (lyd_node *)0x0;
          }
          else {
            local_120 = *(lyd_node **)
                         (*(long *)&plVar1->flags + (ulong)(matchlist._4_4_ - 1) * 0x18);
          }
          iVar6 = lyd_difflist_add(result2,&index,uVar7,LYD_DIFF_MOVEDAFTER1,first_00,local_120);
          if (iVar6 != 0) goto LAB_0018b971;
          item_aux.dist = (item_aux.dist)->next;
          pdVar5 = item_aux.dist;
        }
        item_aux.dist = (item_aux.dist)->next;
      } while (item_aux.dist != pdVar5);
    }
  }
  diff_ordset_free((ly_set *)ordered);
  ordered = (diff_ordered *)0x0;
  if (j != 0) {
    if (index <= i + j + 1) {
      index = i + j + 1;
      _size2 = (lyd_node **)realloc(result2->type,(ulong)index << 2);
      if (_size2 == (lyd_node **)0x0) {
        pLVar8 = ly_errno_location();
        *pLVar8 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
LAB_0018b971:
        while (mlaux != (matchlist_s *)0x0) {
          pmVar11 = mlaux->prev;
          ly_set_free(mlaux->match);
          free(mlaux);
          mlaux = pmVar11;
        }
        diff_ordset_free((ly_set *)ordered);
        lyd_free_diff(result2);
        lyd_free_diff((lyd_difflist *)new);
        return (lyd_difflist *)0x0;
      }
      result2->type = (LYD_DIFFTYPE *)_size2;
      _size2 = (lyd_node **)realloc(result2->first,(ulong)index << 3);
      if (_size2 == (lyd_node **)0x0) {
        pLVar8 = ly_errno_location();
        *pLVar8 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
        goto LAB_0018b971;
      }
      result2->first = _size2;
      _size2 = (lyd_node **)realloc(result2->second,(ulong)index << 3);
      if (_size2 == (lyd_node **)0x0) {
        pLVar8 = ly_errno_location();
        *pLVar8 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
        goto LAB_0018b971;
      }
      result2->second = _size2;
    }
    memcpy(result2->type + i,*new,(ulong)(j + 1) << 2);
    memcpy(result2->first + i,*(void **)((long)new + 8),(ulong)(j + 1) << 3);
    memcpy(result2->second + i,*(void **)((long)new + 0x10),(ulong)(j + 1) << 3);
  }
  lyd_free_diff((lyd_difflist *)new);
  ly_err_clean(1);
  return result2;
LAB_0018ad5c:
  while( true ) {
    bVar14 = false;
    if (mlaux->i < mlaux->match->number) {
      bVar14 = (lys_node *)(mlaux->match->set).s[mlaux->i]->name != aux->schema;
    }
    if (!bVar14) break;
    mlaux->i = mlaux->i + 1;
  }
  if (mlaux->i == mlaux->match->number) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0xb99);
    goto LAB_0018b971;
  }
  next2 = (lyd_node *)(mlaux->match->set).s[mlaux->i]->module;
  if ((lys_module *)next2 == (lys_module *)0x0) {
    next1 = (lyd_node *)(mlaux->match->set).s[mlaux->i];
  }
  mlaux->i = mlaux->i + 1;
  result = (lyd_difflist *)aux->child;
LAB_0018ae9e:
  if (aux == (lyd_node *)0x0) {
    if (iter == _rc) goto LAB_0018b2b7;
  }
  else {
    pmVar11 = (matchlist_s *)malloc(0x18);
    pmVar11->i = 0;
    plVar9 = ly_set_new();
    pmVar11->match = plVar9;
    pmVar11->prev = mlaux;
    mlaux = pmVar11;
  }
LAB_0018af0b:
  if (result == (lyd_difflist *)0x0) {
    ly_set_clean(mlaux->match);
    mlaux->i = 0;
    pmVar11 = mlaux->prev;
    for (aux = iter->parent->next; aux != (lyd_node *)0x0; aux = aux->next) {
      if ((aux->validity & 0x80) != 0) {
        if (pmVar11->i == pmVar11->match->number) {
          if (aux != iter->parent->next) {
            pLVar8 = ly_errno_location();
            *pLVar8 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0xbcd);
            goto LAB_0018b971;
          }
          aux = (lyd_node *)0x0;
          break;
        }
        aux->validity = aux->validity & 0x7f;
        if (((aux->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
           ((aux->schema->flags & 0x100) != 0)) {
          for (local_90 = *(uint *)((long)&ordered->schema + 4); local_90 != 0;
              local_90 = local_90 - 1) {
            plVar1 = ((ly_set_set *)&ordered->parent)->s[local_90 - 1];
            if (((lys_node *)plVar1->name == aux->schema) &&
               (iVar6 = lyd_diff_equivnode((lyd_node *)plVar1->dsc,aux->parent), iVar6 != 0)) {
              lyd_diff_move_preprocess
                        ((diff_ordered *)plVar1,(lyd_node *)(pmVar11->match->set).s[pmVar11->i],aux)
              ;
              break;
            }
          }
        }
        if (((aux->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) &&
           (aux->child != (lyd_node *)0x0)) goto LAB_0018b102;
        pmVar11->i = pmVar11->i + 1;
      }
    }
    goto LAB_0018b244;
  }
  goto LAB_0018b2a8;
LAB_0018b102:
  while( true ) {
    bVar14 = false;
    if (pmVar11->i < pmVar11->match->number) {
      bVar14 = (lys_node *)(pmVar11->match->set).s[pmVar11->i]->name != aux->schema;
    }
    if (!bVar14) break;
    pmVar11->i = pmVar11->i + 1;
  }
  if (pmVar11->i == pmVar11->match->number) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0xbe6);
    goto LAB_0018b971;
  }
  next2 = (lyd_node *)(pmVar11->match->set).s[pmVar11->i]->module;
  if ((lys_module *)next2 == (lys_module *)0x0) {
    next1 = (lyd_node *)(pmVar11->match->set).s[pmVar11->i];
  }
  pmVar11->i = pmVar11->i + 1;
  result = (lyd_difflist *)aux->child;
LAB_0018b244:
  if (aux != (lyd_node *)0x0) goto LAB_0018af0b;
  iter = iter->parent;
  ly_set_free(mlaux->match);
  pmVar11 = mlaux->prev;
  free(mlaux);
  mlaux = pmVar11;
  if (pmVar11->prev == (matchlist_s *)0x0) goto LAB_0018b2a8;
  goto LAB_0018af0b;
LAB_0018b2a8:
  iter = (lyd_node *)result;
  goto LAB_0018a8fd;
}

Assistant:

lyd_difflist *
lyd_diff(struct lyd_node *first, struct lyd_node *second, int options)
{
    int rc;
    struct lyd_node *elem1, *elem2, *iter, *aux, *parent = NULL, *next1, *next2;
    struct lyd_difflist *result, *result2 = NULL;
    void *new;
    unsigned int size, size2, index = 0, index2 = 0, i, j, k;
    struct matchlist_s {
        struct matchlist_s *prev;
        struct ly_set *match;
        unsigned int i;
    } *matchlist = NULL, *mlaux;
    struct ly_set *ordset = NULL;
    struct diff_ordered *ordered;
    struct diff_ordered_dist *dist_aux, *dist_iter;
    struct diff_ordered_item item_aux;

    if (!first) {
        /* all nodes in second were created,
         * but the second must be top level */
        if (second && second->parent) {
            LOGERR(LY_EINVAL, "%s: \"first\" parameter is NULL and \"second\" is not top level.", __func__);
            return NULL;
        }
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(second, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_CREATED, NULL, iter)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    } else if (!second) {
        /* all nodes from first were deleted */
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(first, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, iter, NULL)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    }

    if (options & LYD_DIFFOPT_NOSIBLINGS) {
        /* both trees must start at the same (schema) node */
        if (first->schema != second->schema) {
            LOGERR(LY_EINVAL, "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.", __func__);
            return NULL;
        }
        /* use first's and second's child to make comparison the same as without LYD_OPT_NOSIBLINGS */
        first = first->child;
        second = second->child;
    } else {
        /* go to the first sibling in both trees */
        if (first->parent) {
            first = first->parent->child;
        } else {
            while (first->prev->next) {
                first = first->prev;
            }
        }

        if (second->parent) {
            second = second->parent->child;
        } else {
            for (; second->prev->next; second = second->prev);
        }

        /* check that both has the same (schema) parent or that they are top-level nodes */
        if ((first->parent && second->parent && first->parent->schema != second->parent->schema) ||
                (!first->parent && first->parent != second->parent)) {
            LOGERR(LY_EINVAL, "%s: incompatible trees with different parents.", __func__);
            return NULL;
        }
    }
    if (first == second) {
        LOGERR(LY_EINVAL, "%s: comparing the same tree does not make sense.", __func__);
        return NULL;
    }

    /* initiate resulting structure */
    result = lyd_diff_init_difflist(&size);

    /* the records about created and moved items are created in
     * bad order, so the records about created nodes (and their
     * possible moving) is stored separately and added to the
     * main result at the end.
     */
    result2 = lyd_diff_init_difflist(&size2);

    matchlist = malloc(sizeof *matchlist);
    matchlist->i = 0;
    matchlist->match = ly_set_new();
    matchlist->prev = NULL;

    ordset = ly_set_new();

    /*
     * compare trees
     */
    /* 1) newly created nodes + changed leafs/anyxmls */
    next1 = first;
    for (elem2 = next2 = second; elem2; elem2 = next2) {
        /* keep right pointer for searching in the first tree */
        elem1 = next1;

        if (elem2->dflt && !(options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* skip default elements, they could not be created or changed, just deleted */
            goto cmp_continue;
        }

        /* search for elem2 instance in the first */
        LY_TREE_FOR(elem1, iter) {
            if (iter->schema != elem2->schema) {
                continue;
            }

            /* elem2 instance found */
            rc = lyd_diff_compare(iter, elem2, result, &size, &index, matchlist->match, ordset, options);
            if (rc == -1) {
                goto error;
            } else if (rc == 0) {
                /* match */
                break;
            } /* else, continue */
        }

        if (!iter) {
            /* elem2 not found in the first tree */
            if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_CREATED, elem1 ? elem1->parent : parent, elem2)) {
                goto error;
            }

            if (elem1 && (elem2->schema->flags & LYS_USERORDERED)) {
                /* store the correct place where the node is supposed to be moved after creation */
                /* if elem1 does not exist, all nodes were created and they will be created in
                 * correct order, so it is not needed to detect moves */
                for (aux = elem2->prev; aux->next; aux = aux->prev) {
                    if (aux->schema == elem2->schema) {
                        /* predecessor found */
                        break;
                    }
                }
                if (!aux->next) {
                    /* predecessor not found */
                    aux = NULL;
                }
                if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_MOVEDAFTER2, aux, elem2)) {
                    goto error;
                }
            }
        }

cmp_continue:
        /* select element for the next run                                    1     2
         * - first, process all siblings of a single parent                  / \   / \
         * - then, go to children (deep)                                    3   4 7   8
         * - return to the parent's next sibling children                  / \
         *                                                                5   6
         */
        /* siblings first */
        next1 = elem1;
        next2 = elem2->next;

        if (!next2) {
            /* children */

            /* first pass of the siblings done, some additional work for future
             * detection of move may be needed */
            for (i = ordset->number; i > 0; i--) {
                ordered = (struct diff_ordered *)ordset->set.g[i - 1];
                if (ordered->items) {
                    /* already preprocessed ordered structure */
                    break;
                }
                ordered->items = calloc(ordered->count, sizeof *ordered->items);
                ordered->dist = NULL;
                /* zero the count to be used as a node position in lyd_diff_move_preprocess() */
                ordered->count = 0;
            }

            /* first, get the first sibling */
            if (elem2->parent == second->parent) {
                elem2 = second;
            } else {
                elem2 = elem2->parent->child;
            }

            /* and then find the first child */
            for (iter = elem2; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    /* the iter is not present in both trees */
                    continue;
                } else if (matchlist->i == matchlist->match->number) {
                    if (iter == elem2) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, matchlist->match->set.d[matchlist->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (matchlist->i < matchlist->match->number && matchlist->match->set.d[matchlist->i]->schema != iter->schema) {
                        matchlist->i++;
                    }
                    if (matchlist->i == matchlist->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = matchlist->match->set.d[matchlist->i]->child;
                    if (!next1) {
                        parent = matchlist->match->set.d[matchlist->i];
                    }
                    matchlist->i++;
                    next2 = iter->child;
                    break;
                }
                matchlist->i++;
            }

            if (!iter) {
                /* no child/data on next level */
                if (elem2 == second) {
                    /* done */
                    break;
                }
            } else {
                /* create new matchlist item */
                mlaux = malloc(sizeof *mlaux);
                mlaux->i = 0;
                mlaux->match = ly_set_new();
                mlaux->prev = matchlist;
                matchlist = mlaux;
            }
        }

        while (!next2) {
            /* parent */

            /* clean the last match set */
            ly_set_clean(matchlist->match);
            matchlist->i = 0;

            /* try to go to a cousin - child of the next parent's sibling */
            mlaux = matchlist->prev;
            for (iter = elem2->parent->next; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    continue;
                } else if (mlaux->i == mlaux->match->number) {
                    if (iter == elem2->parent->next) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number ; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, mlaux->match->set.d[mlaux->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (mlaux->i < mlaux->match->number && mlaux->match->set.d[mlaux->i]->schema != iter->schema) {
                        mlaux->i++;
                    }
                    if (mlaux->i == mlaux->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = mlaux->match->set.d[mlaux->i]->child;
                    if (!next1) {
                        parent = mlaux->match->set.d[mlaux->i];
                    }
                    mlaux->i++;
                    next2 = iter->child;
                    break;
                }
                mlaux->i++;
            }

            /* if no cousin exists, continue next loop on higher level */
            if (!iter) {
                elem2 = elem2->parent;

                /* remove matchlist item */
                ly_set_free(matchlist->match);
                mlaux = matchlist;
                matchlist = matchlist->prev;
                free(mlaux);

                if (!matchlist->prev) { /* elem2->parent == second->parent */
                    /* done */
                    break;
                }
            }
        }
    }

    ly_set_free(matchlist->match);
    free(matchlist);
    matchlist = NULL;


    /* 2) deleted nodes */
    LY_TREE_DFS_BEGIN(first, next1, elem1) {
        /* search for elem1s deleted in the second */
        if (elem1->validity & LYD_VAL_INUSE) {
            /* erase temporary LYD_VAL_INUSE flag and continue into children */
            elem1->validity &= ~LYD_VAL_INUSE;
        } else if (!elem1->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* elem1 has no matching node in second, add it into result */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, elem1, NULL)) {
                goto error;
            }

            /* skip subtree processing of data missing in the second tree */
            goto dfs_nextsibling;
        }

        /* modified LY_TREE_DFS_END() */
        /* select element for the next run - children first */
        if (elem1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next1 = NULL;
        } else {
            next1 = elem1->child;
        }
        if (!next1) {
dfs_nextsibling:
            /* try siblings */
            next1 = elem1->next;
        }
        while (!next1) {
            /* parent is already processed, go to its sibling */

            elem1 = elem1->parent;
            if (elem1 == first->parent) {
                /* we are done, no next element to process */
                break;
            }

            next1 = elem1->next;
        }
    }

    /* 3) moved nodes (when user-ordered) */
    for (i = 0; i < ordset->number; i++) {
        ordered = (struct diff_ordered *)ordset->set.g[i];
        if (!ordered->dist->dist) {
            /* the dist list is sorted here, but the biggest dist is 0,
             * so nothing changed in order of these items between first
             * and second. We can continue with another user-ordered list.
             */
            continue;
        }

        /* get needed movements
         * - from the biggest distances try to apply node movements
         * on first tree node until they will be ordered as in the
         * second tree - i.e. until there will be no position difference
         */

        for (dist_iter = ordered->dist; ; dist_iter = dist_iter->next) {
            /* dist list is sorted at the beginning, since applying a move causes
             * just a small change in other distances, we assume that the biggest
             * dist is the next one (note that dist list is implemented as ring
             * list). This way we avoid sorting distances after each move. The loop
             * stops when all distances are zero.
             */
            dist_aux = dist_iter;
            while (!dist_iter->dist) {
                /* no dist, so no move. Try another, but when
                 * there is no dist at all, stop the loop
                 */
                dist_iter = dist_iter->next;
                if (dist_iter == dist_aux) {
                    /* all dist we zeroed */
                    goto movedone;
                }
            }
            /* something to move */

            /* get the item to move */
            for (k = 0; k < ordered->count; k++) {
                if (ordered->items[k].dist == dist_iter) {
                    break;
                }
            }

            /* apply the move (distance) */
            memcpy(&item_aux, &ordered->items[k], sizeof item_aux);
            if (dist_iter->dist > 0) {
                /* move to right (other move to left) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k + 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist++; /* update moved item distance */
                    dist_iter->dist--;
                    k++;
                }
            } else {
                /* move to left (other move to right) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k - 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist--; /* update moved item distance */
                    dist_iter->dist++;
                    k--;
                }
            }
            memcpy(&ordered->items[k], &item_aux, sizeof *ordered->items);

            /* store the transaction into the difflist */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_MOVEDAFTER1, item_aux.first,
                                 (k > 0) ? ordered->items[k - 1].first : NULL)) {
                goto error;
            }
            continue;

movedone:
            break;
        }
    }

    diff_ordset_free(ordset);
    ordset = NULL;

    if (index2) {
        /* append result2 with newly created
         * (and possibly moved) nodes */
        if (index + index2 + 1 >= size) {
            /* result must be enlarged */
            size = index + index2 + 1;
            new = realloc(result->type, size * sizeof *result->type);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->type = new;

            new = realloc(result->first, size * sizeof *result->first);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->first = new;

            new = realloc(result->second, size * sizeof *result->second);
            if (!new) {
                LOGMEM ;
                goto error;
            }
            result->second = new;
        }

        /* append */
        memcpy(&result->type[index], result2->type, (index2 + 1) * sizeof *result->type);
        memcpy(&result->first[index], result2->first, (index2 + 1) * sizeof *result->first);
        memcpy(&result->second[index], result2->second, (index2 + 1) * sizeof *result->second);
    }
    lyd_free_diff(result2);

    ly_err_clean(1);
    return result;

error:

    while (matchlist) {
        mlaux = matchlist;
        matchlist = mlaux->prev;
        ly_set_free(mlaux->match);
        free(mlaux);

    }
    diff_ordset_free(ordset);

    lyd_free_diff(result);
    lyd_free_diff(result2);

    return NULL;
}